

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O2

bool spvtools::CFA<spvtools::opt::DominatorTreeNode>::FindInWorkList
               (vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                *work_list,uint32_t id)

{
  pointer pbVar1;
  pointer pbVar2;
  uint32_t uVar3;
  pointer pbVar4;
  block_info *b;
  
  pbVar1 = (work_list->
           super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (work_list->
           super__Vector_base<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    if (pbVar4 == pbVar1) break;
    uVar3 = opt::DominatorTreeNode::id(pbVar4->block);
    pbVar2 = pbVar4 + 1;
  } while (uVar3 != id);
  return pbVar4 != pbVar1;
}

Assistant:

bool CFA<BB>::FindInWorkList(const std::vector<block_info>& work_list,
                             uint32_t id) {
  for (const auto& b : work_list) {
    if (b.block->id() == id) return true;
  }
  return false;
}